

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

LoadConstantLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_loadconstant(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LoadConstantLayerParams *pLVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x122) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x122;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pLVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::LoadConstantLayerParams>(arena);
    (this->layer_).loadconstant_ = pLVar2;
  }
  return (LoadConstantLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LoadConstantLayerParams* NeuralNetworkLayer::_internal_mutable_loadconstant() {
  if (!_internal_has_loadconstant()) {
    clear_layer();
    set_has_loadconstant();
    layer_.loadconstant_ = CreateMaybeMessage< ::CoreML::Specification::LoadConstantLayerParams >(GetArenaForAllocation());
  }
  return layer_.loadconstant_;
}